

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_schnorrsig_api(void)

{
  _func_void_char_ptr_void_ptr *p_Var1;
  void *pvVar2;
  secp256k1_context *psVar3;
  int iVar4;
  secp256k1_callback _saved_callback_14;
  int32_t _calls_to_callback_14;
  secp256k1_callback _saved_callback_13;
  int32_t _calls_to_callback_13;
  secp256k1_callback _saved_callback_12;
  int32_t _calls_to_callback_12;
  secp256k1_callback _saved_callback_11;
  int32_t _calls_to_callback_11;
  secp256k1_callback _saved_callback_10;
  int32_t _calls_to_callback_10;
  secp256k1_callback _saved_callback_9;
  int32_t _calls_to_callback_9;
  secp256k1_callback _saved_callback_8;
  int32_t _calls_to_callback_8;
  secp256k1_callback _saved_callback_7;
  int32_t _calls_to_callback_7;
  secp256k1_callback _saved_callback_6;
  int32_t _calls_to_callback_6;
  secp256k1_callback _saved_callback_5;
  int32_t _calls_to_callback_5;
  secp256k1_callback _saved_callback_4;
  int32_t _calls_to_callback_4;
  secp256k1_callback _saved_callback_3;
  int32_t _calls_to_callback_3;
  secp256k1_callback _saved_callback_2;
  int32_t _calls_to_callback_2;
  secp256k1_callback _saved_callback_1;
  int32_t _calls_to_callback_1;
  secp256k1_callback _saved_callback;
  int32_t _calls_to_callback;
  secp256k1_schnorrsig_extraparams invalid_extraparams;
  secp256k1_schnorrsig_extraparams extraparams;
  uchar sig [64];
  secp256k1_xonly_pubkey zero_pk;
  secp256k1_xonly_pubkey pk [3];
  secp256k1_keypair invalid_keypair;
  secp256k1_keypair keypairs [3];
  uchar msg [32];
  uchar sk3 [32];
  uchar sk2 [32];
  uchar sk1 [32];
  _func_void_char_ptr_void_ptr *in_stack_fffffffffffffb18;
  secp256k1_context *in_stack_fffffffffffffb20;
  secp256k1_keypair *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  uchar *in_stack_fffffffffffffb38;
  secp256k1_context *in_stack_fffffffffffffb40;
  secp256k1_keypair *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffb80;
  secp256k1_context *in_stack_fffffffffffffb88;
  uchar *in_stack_fffffffffffffb98;
  secp256k1_keypair *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  undefined1 local_378 [24];
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined1 local_308 [96];
  undefined1 local_208 [520];
  
  memset(local_208,0,0x60);
  local_360 = 0x8cb36fda;
  local_358 = 0;
  local_350 = 0;
  memset(local_378,0,0x18);
  testrand256((uchar *)in_stack_fffffffffffffb20);
  testrand256((uchar *)in_stack_fffffffffffffb20);
  testrand256((uchar *)in_stack_fffffffffffffb20);
  testrand256((uchar *)in_stack_fffffffffffffb20);
  iVar4 = secp256k1_keypair_create
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                     in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x7b,"test condition failed: secp256k1_keypair_create(CTX, &keypairs[0], sk1) == 1");
    abort();
  }
  iVar4 = secp256k1_keypair_create
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                     in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x7c,"test condition failed: secp256k1_keypair_create(CTX, &keypairs[1], sk2) == 1");
    abort();
  }
  iVar4 = secp256k1_keypair_create
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                     in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x7d,"test condition failed: secp256k1_keypair_create(CTX, &keypairs[2], sk3) == 1");
    abort();
  }
  iVar4 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                     (int *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                     in_stack_fffffffffffffb70);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x7e,
            "test condition failed: secp256k1_keypair_xonly_pub(CTX, &pk[0], NULL, &keypairs[0]) == 1"
           );
    abort();
  }
  iVar4 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                     (int *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                     in_stack_fffffffffffffb70);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x7f,
            "test condition failed: secp256k1_keypair_xonly_pub(CTX, &pk[1], NULL, &keypairs[1]) == 1"
           );
    abort();
  }
  iVar4 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                     (int *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                     in_stack_fffffffffffffb70);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x80,
            "test condition failed: secp256k1_keypair_xonly_pub(CTX, &pk[2], NULL, &keypairs[2]) == 1"
           );
    abort();
  }
  memset(local_308,0,0x40);
  iVar4 = secp256k1_schnorrsig_sign32
                    (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                     (uchar *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                     in_stack_fffffffffffffb28,(uchar *)in_stack_fffffffffffffb20);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x84,
            "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypairs[0], NULL) == 1"
           );
    abort();
  }
  p_Var1 = (CTX->illegal_callback).fn;
  pvVar2 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,(void *)0x1542e8);
  iVar4 = secp256k1_schnorrsig_sign32
                    (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                     (uchar *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                     in_stack_fffffffffffffb28,(uchar *)in_stack_fffffffffffffb20);
  psVar3 = CTX;
  if (iVar4 == 0) {
    (CTX->illegal_callback).fn = p_Var1;
    (psVar3->illegal_callback).data = pvVar2;
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x85,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
          ,0x85,
          "test condition failed: (secp256k1_schnorrsig_sign32(CTX, ((void*)0), msg, &keypairs[0], ((void*)0))) == 0"
         );
  abort();
}

Assistant:

static void test_schnorrsig_api(void) {
    unsigned char sk1[32];
    unsigned char sk2[32];
    unsigned char sk3[32];
    unsigned char msg[32];
    secp256k1_keypair keypairs[3];
    secp256k1_keypair invalid_keypair = {{ 0 }};
    secp256k1_xonly_pubkey pk[3];
    secp256k1_xonly_pubkey zero_pk;
    unsigned char sig[64];
    secp256k1_schnorrsig_extraparams extraparams = SECP256K1_SCHNORRSIG_EXTRAPARAMS_INIT;
    secp256k1_schnorrsig_extraparams invalid_extraparams = {{ 0 }, NULL, NULL};

    testrand256(sk1);
    testrand256(sk2);
    testrand256(sk3);
    testrand256(msg);
    CHECK(secp256k1_keypair_create(CTX, &keypairs[0], sk1) == 1);
    CHECK(secp256k1_keypair_create(CTX, &keypairs[1], sk2) == 1);
    CHECK(secp256k1_keypair_create(CTX, &keypairs[2], sk3) == 1);
    CHECK(secp256k1_keypair_xonly_pub(CTX, &pk[0], NULL, &keypairs[0]) == 1);
    CHECK(secp256k1_keypair_xonly_pub(CTX, &pk[1], NULL, &keypairs[1]) == 1);
    CHECK(secp256k1_keypair_xonly_pub(CTX, &pk[2], NULL, &keypairs[2]) == 1);
    memset(&zero_pk, 0, sizeof(zero_pk));

    /** main test body **/
    CHECK(secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypairs[0], NULL) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_sign32(CTX, NULL, msg, &keypairs[0], NULL));
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_sign32(CTX, sig, NULL, &keypairs[0], NULL));
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_sign32(CTX, sig, msg, NULL, NULL));
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_sign32(CTX, sig, msg, &invalid_keypair, NULL));
    CHECK_ILLEGAL(STATIC_CTX, secp256k1_schnorrsig_sign32(STATIC_CTX, sig, msg, &keypairs[0], NULL));

    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypairs[0], &extraparams) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_sign_custom(CTX, NULL, msg, sizeof(msg), &keypairs[0], &extraparams));
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_sign_custom(CTX, sig, NULL, sizeof(msg), &keypairs[0], &extraparams));
    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig, NULL, 0, &keypairs[0], &extraparams) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), NULL, &extraparams));
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &invalid_keypair, &extraparams));
    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypairs[0], NULL) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypairs[0], &invalid_extraparams));
    CHECK_ILLEGAL(STATIC_CTX, secp256k1_schnorrsig_sign_custom(STATIC_CTX, sig, msg, sizeof(msg), &keypairs[0], &extraparams));

    CHECK(secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypairs[0], NULL) == 1);
    CHECK(secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &pk[0]) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_verify(CTX, NULL, msg, sizeof(msg), &pk[0]));
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_verify(CTX, sig, NULL, sizeof(msg), &pk[0]));
    CHECK(secp256k1_schnorrsig_verify(CTX, sig, NULL, 0, &pk[0]) == 0);
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), NULL));
    CHECK_ILLEGAL(CTX, secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &zero_pk));
}